

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathVec.h
# Opt level: O1

double __thiscall Imath_3_2::Vec3<double>::lengthTiny(Vec3<double> *this)

{
  double dVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  
  dVar1 = this->x;
  dVar7 = this->y;
  uVar3 = -(ulong)(dVar1 < -dVar1);
  uVar5 = -(ulong)(dVar7 < -dVar7);
  uVar4 = (ulong)-dVar7 & uVar5;
  auVar9._0_8_ = ~uVar3 & (ulong)dVar1;
  auVar9._8_8_ = ~uVar5 & (ulong)dVar7;
  auVar2._8_4_ = (int)uVar4;
  auVar2._0_8_ = (ulong)-dVar1 & uVar3;
  auVar2._12_4_ = (int)(uVar4 >> 0x20);
  dVar1 = this->z;
  uVar4 = -(ulong)(dVar1 < -dVar1);
  dVar6 = (double)(~uVar4 & (ulong)dVar1 | (ulong)-dVar1 & uVar4);
  dVar1 = SUB168(auVar9 | auVar2,8);
  dVar8 = SUB168(auVar9 | auVar2,0);
  dVar7 = dVar1;
  if (dVar1 <= dVar8) {
    dVar7 = dVar8;
  }
  dVar10 = dVar6;
  if (dVar6 <= dVar7) {
    dVar10 = dVar7;
  }
  dVar7 = 0.0;
  if ((dVar10 != 0.0) || (NAN(dVar10))) {
    dVar7 = (dVar6 / dVar10) * (dVar6 / dVar10) +
            (dVar8 / dVar10) * (dVar8 / dVar10) + (dVar1 / dVar10) * (dVar1 / dVar10);
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = dVar10 * dVar7;
  }
  return dVar7;
}

Assistant:

IMATH_HOSTDEVICE IMATH_CONSTEXPR14 inline T
Vec3<T>::lengthTiny () const IMATH_NOEXCEPT
{
    T absX = (x >= T (0)) ? x : -x;
    T absY = (y >= T (0)) ? y : -y;
    T absZ = (z >= T (0)) ? z : -z;

    T max = absX;

    if (max < absY) max = absY;

    if (max < absZ) max = absZ;

    if (IMATH_UNLIKELY (max == T (0))) return T (0);

    //
    // Do not replace the divisions by max with multiplications by 1/max.
    // Computing 1/max can overflow but the divisions below will always
    // produce results less than or equal to 1.
    //

    absX /= max;
    absY /= max;
    absZ /= max;

    return max * std::sqrt (absX * absX + absY * absY + absZ * absZ);
}